

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

double Cipher::calcPClusters
                 (TParameters *param_1,TSimilarityMap *param_2,TSimilarityMap *logMap,
                 TSimilarityMap *logMapInv,TClusters *clusters,TClusterToLetterMap *param_6)

{
  double dVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RCX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RDX;
  vector<int,_std::allocator<int>_> *in_R8;
  int i;
  int j;
  int n;
  double res;
  int local_44;
  int local_40;
  double local_38;
  
  local_38 = 0.0;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(in_R8);
  iVar3 = (int)sVar4;
  for (local_40 = 0; local_44 = local_40, local_40 < iVar3 + -1; local_40 = local_40 + 1) {
    while (local_44 = local_44 + 1, local_44 < iVar3) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)local_44);
      iVar2 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)local_40);
      if (iVar2 == *pvVar5) {
        pvVar6 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](in_RDX,(long)local_40);
        pvVar7 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar6,(long)local_44);
        dVar1 = pvVar7->cc;
      }
      else {
        pvVar6 = std::
                 vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 ::operator[](in_RCX,(long)local_40);
        pvVar7 = std::vector<stMatch,_std::allocator<stMatch>_>::operator[](pvVar6,(long)local_44);
        dVar1 = pvVar7->cc;
      }
      local_38 = dVar1 + local_38;
    }
  }
  return local_38 / ((double)(iVar3 * (iVar3 + -1)) / 2.0);
}

Assistant:

double calcPClusters(
            const TParameters & ,
            const TSimilarityMap & ,
            const TSimilarityMap & logMap,
            const TSimilarityMap & logMapInv,
            const TClusters & clusters,
            const TClusterToLetterMap & ) {

        double res = 0.0;
        int n = clusters.size();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                if (clusters[i] == clusters[j]) {
                    res += logMap[j][i].cc;
                } else {
                    res += logMapInv[j][i].cc;
                }
            }
        }

        return res/((n*(n-1))/2.0);
    }